

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

int __thiscall
LiteScript::Syntax::ReadControlSwitch
          (Syntax *this,char *text,
          vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
          ErrorType *errorType)

{
  Syntax SVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ErrorType *pEVar10;
  uint i_3;
  ulong uVar11;
  uint i;
  long lVar12;
  Syntax *pSVar13;
  long lVar14;
  uint i_2;
  int iVar15;
  bool bVar16;
  string keyword;
  ulong local_a0;
  ulong local_98;
  allocator local_89;
  Instruction local_88;
  undefined1 local_78 [16];
  Instruction local_68;
  string local_58;
  ErrorType *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  uVar5 = ReadName((char *)this,&local_58);
  iVar15 = 0;
  if ((uVar5 == 0) ||
     (iVar6 = std::__cxx11::string::compare((char *)&local_58), iVar15 = 0, iVar6 != 0))
  goto LAB_0013b0a2;
  uVar11 = 0;
  while( true ) {
    while( true ) {
      iVar6 = (int)uVar11;
      if ((0x20 < (ulong)(byte)this[uVar11 + 6]) ||
         ((0x100000600U >> ((ulong)(byte)this[uVar11 + 6] & 0x3f) & 1) == 0)) break;
      uVar11 = (ulong)(iVar6 + 1);
    }
    uVar5 = ReadComment((char *)(this + uVar11 + 6));
    if (uVar5 == 0) break;
    uVar11 = (ulong)(iVar6 + uVar5);
  }
  if (this[(long)iVar6 + 6] == (Syntax)0x28) {
    lVar12 = (long)iVar6 + 7;
    uVar11 = 0;
    while( true ) {
      while( true ) {
        iVar15 = (int)uVar11;
        if ((0x20 < (ulong)(byte)this[uVar11 + lVar12]) ||
           ((0x100000600U >> ((ulong)(byte)this[uVar11 + lVar12] & 0x3f) & 1) == 0)) break;
        uVar11 = (ulong)(iVar15 + 1);
      }
      uVar5 = ReadComment((char *)(this + uVar11 + lVar12));
      if (uVar5 == 0) break;
      uVar11 = (ulong)(iVar15 + uVar5);
    }
    iVar6 = iVar15 + iVar6 + 7;
    iVar7 = ReadExpression(this + iVar6,text,instrl,errorType);
    if (0 < iVar7) {
      iVar7 = iVar7 + iVar6;
      uVar11 = 0;
      while( true ) {
        while( true ) {
          iVar15 = (int)uVar11;
          if ((0x20 < (ulong)(byte)this[uVar11 + (long)iVar7]) ||
             ((0x100000600U >> ((ulong)(byte)this[uVar11 + (long)iVar7] & 0x3f) & 1) == 0)) break;
          uVar11 = (ulong)(iVar15 + 1);
        }
        uVar5 = ReadComment((char *)(this + uVar11 + (long)iVar7));
        if (uVar5 == 0) break;
        uVar11 = (ulong)(iVar15 + uVar5);
      }
      iVar15 = iVar15 + iVar7;
      if (this[iVar15] == (Syntax)0x29) {
        lVar12 = (long)iVar15 + 1;
        uVar5 = 0;
        while( true ) {
          while( true ) {
            if ((0x20 < (ulong)(byte)this[(ulong)uVar5 + lVar12]) ||
               ((0x100000600U >> ((ulong)(byte)this[(ulong)uVar5 + lVar12] & 0x3f) & 1) == 0))
            break;
            uVar5 = uVar5 + 1;
          }
          uVar8 = ReadComment((char *)(this + (ulong)uVar5 + lVar12));
          if (uVar8 == 0) break;
          uVar5 = uVar5 + uVar8;
        }
        iVar15 = uVar5 + iVar15 + 1;
        if (this[iVar15] != (Syntax)0x7b) {
          *(undefined4 *)
           &(instrl->
            super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
            _M_impl.super__Vector_impl_data._M_start = 0x1a;
LAB_0013ab4b:
          iVar15 = -iVar15;
          goto LAB_0013b0a2;
        }
        lVar12 = (long)iVar15 + 1;
        uVar11 = 0;
        while( true ) {
          while( true ) {
            iVar6 = (int)uVar11;
            if ((0x20 < (ulong)(byte)this[uVar11 + lVar12]) ||
               ((0x100000600U >> ((ulong)(byte)this[uVar11 + lVar12] & 0x3f) & 1) == 0)) break;
            uVar11 = (ulong)(iVar6 + 1);
          }
          uVar5 = ReadComment((char *)(this + uVar11 + lVar12));
          if (uVar5 == 0) break;
          uVar11 = (ulong)(iVar6 + uVar5);
        }
        iVar15 = iVar6 + iVar15 + 1;
        lVar12 = (long)iVar15;
        local_98 = 0xffffffff;
        pEVar10 = (ErrorType *)(*(long *)(text + 8) - *(long *)text);
        local_38 = pEVar10;
        if (this[lVar12] == (Syntax)0x7d) {
          local_a0 = 0xffffffff;
        }
        else {
          local_a0 = 0xffffffff;
          local_98 = 0xffffffff;
          do {
            pSVar13 = this + lVar12;
            uVar11 = 0;
            while( true ) {
              while( true ) {
                iVar6 = (int)uVar11;
                if ((0x20 < (ulong)(byte)pSVar13[uVar11]) ||
                   ((0x100000600U >> ((ulong)(byte)pSVar13[uVar11] & 0x3f) & 1) == 0)) break;
                uVar11 = (ulong)(iVar6 + 1);
              }
              uVar5 = ReadComment((char *)(pSVar13 + uVar11));
              if (uVar5 == 0) break;
              uVar11 = (ulong)(iVar6 + uVar5);
            }
            if (iVar6 < 1) {
              uVar5 = ReadName((char *)pSVar13,&local_58);
              if (uVar5 == 0) {
                *(undefined4 *)
                 &(instrl->
                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                  )._M_impl.super__Vector_impl_data._M_start = 0x12;
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)&local_58);
                if (iVar6 == 0) {
                  uVar11 = 0;
                  while( true ) {
                    while( true ) {
                      iVar6 = (int)uVar11;
                      if ((0x20 < (ulong)(byte)this[uVar11 + (long)iVar15 + 4]) ||
                         ((0x100000600U >> ((ulong)(byte)this[uVar11 + (long)iVar15 + 4] & 0x3f) & 1
                          ) == 0)) break;
                      uVar11 = (ulong)(iVar6 + 1);
                    }
                    uVar5 = ReadComment((char *)(this + uVar11 + (long)iVar15 + 4));
                    if (uVar5 == 0) break;
                    uVar11 = (ulong)(iVar6 + uVar5);
                  }
                  Instruction::Instruction(&local_88,INSTR_VALUE_COPY);
                  std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                  emplace_back<LiteScript::Instruction>
                            ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              *)text,&local_88);
                  iVar6 = iVar6 + iVar15 + 4;
                  Instruction::~Instruction(&local_88);
                  iVar7 = ReadExpression(this + iVar6,text,instrl,pEVar10);
                  if (iVar7 < 1) goto LAB_0013b08b;
                  iVar7 = iVar7 + iVar6;
                  uVar11 = 0;
                  while( true ) {
                    while( true ) {
                      iVar15 = (int)uVar11;
                      if ((0x20 < (ulong)(byte)this[uVar11 + (long)iVar7]) ||
                         ((0x100000600U >> ((ulong)(byte)this[uVar11 + (long)iVar7] & 0x3f) & 1) ==
                          0)) break;
                      uVar11 = (ulong)(iVar15 + 1);
                    }
                    uVar5 = ReadComment((char *)(this + uVar11 + (long)iVar7));
                    if (uVar5 == 0) break;
                    uVar11 = (ulong)(iVar15 + uVar5);
                  }
                  iVar15 = iVar15 + iVar7;
                  if (this[iVar15] == (Syntax)0x3a) {
                    lVar12 = (long)iVar15 + 1;
                    uVar5 = 0;
                    while( true ) {
                      while( true ) {
                        if ((0x20 < (ulong)(byte)this[(ulong)uVar5 + lVar12]) ||
                           ((0x100000600U >> ((ulong)(byte)this[(ulong)uVar5 + lVar12] & 0x3f) & 1)
                            == 0)) break;
                        uVar5 = uVar5 + 1;
                      }
                      uVar8 = ReadComment((char *)(this + (ulong)uVar5 + lVar12));
                      if (uVar8 == 0) break;
                      uVar5 = uVar5 + uVar8;
                    }
                    Instruction::Instruction(&local_88,INSTR_OP_EQU);
                    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                    emplace_back<LiteScript::Instruction>
                              ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                *)text,&local_88);
                    Instruction::~Instruction(&local_88);
                    lVar12 = *(long *)(text + 8);
                    lVar3 = *(long *)text;
                    Instruction::Instruction(&local_88,INSTR_JUMP_ELSE);
                    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                    emplace_back<LiteScript::Instruction>
                              ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                *)text,&local_88);
                    Instruction::~Instruction(&local_88);
                    if (-1 < (int)local_98) {
                      Instruction::Instruction
                                (&local_88,INSTR_JUMP_TO,
                                 (int)((ulong)(*(long *)(text + 8) - *(long *)text) >> 4));
                      Instruction::operator=
                                ((Instruction *)((local_98 & 0xffffffff) * 0x10 + *(long *)text),
                                 &local_88);
                      Instruction::~Instruction(&local_88);
                    }
                    iVar15 = uVar5 + iVar15 + 1;
                    lVar14 = (long)iVar15;
                    SVar1 = this[lVar14];
                    while (SVar1 != (Syntax)0x7d) {
                      pSVar13 = this + lVar14;
                      uVar5 = ReadName((char *)pSVar13,&local_58);
                      if (uVar5 != 0) {
                        iVar6 = std::__cxx11::string::compare((char *)&local_58);
                        if ((iVar6 == 0) ||
                           (iVar6 = std::__cxx11::string::compare((char *)&local_58), iVar6 == 0))
                        break;
                      }
                      uVar11 = 0;
                      while( true ) {
                        while( true ) {
                          iVar6 = (int)uVar11;
                          if ((0x20 < (ulong)(byte)pSVar13[uVar11]) ||
                             ((0x100000600U >> ((ulong)(byte)pSVar13[uVar11] & 0x3f) & 1) == 0))
                          break;
                          uVar11 = (ulong)(iVar6 + 1);
                        }
                        uVar5 = ReadComment((char *)(pSVar13 + uVar11));
                        if (uVar5 == 0) break;
                        uVar11 = (ulong)(iVar6 + uVar5);
                      }
                      if (iVar6 < 1) {
                        iVar6 = ReadInstruction(pSVar13,text,instrl,pEVar10);
                        if (iVar6 < 1) {
                          if (iVar6 == 0) {
                            *(undefined4 *)
                             &(instrl->
                              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              )._M_impl.super__Vector_impl_data._M_start = 0x22;
                            goto LAB_0013aaf1;
                          }
                          iVar15 = iVar6 - iVar15;
                          goto LAB_0013b0a2;
                        }
                      }
                      iVar15 = iVar15 + iVar6;
                      lVar14 = (long)iVar15;
                      SVar1 = this[lVar14];
                    }
                    lVar14 = *(long *)(text + 8);
                    lVar2 = *(long *)text;
                    Instruction::Instruction(&local_88,INSTR_JUMP_TO);
                    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                    emplace_back<LiteScript::Instruction>
                              ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                *)text,&local_88);
                    local_a0 = lVar12 - lVar3 >> 4;
                    local_98 = (ulong)(lVar14 - lVar2) >> 4;
                    Instruction::~Instruction(&local_88);
                    if (-1 < (int)(uint)local_a0) {
                      Instruction::Instruction
                                (&local_88,INSTR_JUMP_ELSE,
                                 (int)((ulong)(*(long *)(text + 8) - *(long *)text) >> 4));
                      Instruction::operator=
                                ((Instruction *)
                                 ((ulong)((uint)local_a0 & 0x7fffffff) * 0x10 + *(long *)text),
                                 &local_88);
                      Instruction::~Instruction(&local_88);
                    }
                    goto LAB_0013aee3;
                  }
                  *(undefined4 *)
                   &(instrl->
                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                    )._M_impl.super__Vector_impl_data._M_start = 0x1c;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)&local_58);
                  if (iVar6 == 0) {
                    uVar5 = 0;
                    while( true ) {
                      while( true ) {
                        if ((0x20 < (ulong)(byte)this[(ulong)uVar5 + (long)iVar15 + 7]) ||
                           ((0x100000600U >>
                             ((ulong)(byte)this[(ulong)uVar5 + (long)iVar15 + 7] & 0x3f) & 1) == 0))
                        break;
                        uVar5 = uVar5 + 1;
                      }
                      uVar8 = ReadComment((char *)(this + (ulong)uVar5 + (long)iVar15 + 7));
                      if (uVar8 == 0) break;
                      uVar5 = uVar5 + uVar8;
                    }
                    iVar15 = uVar5 + iVar15 + 7;
                    if (this[iVar15] != (Syntax)0x3a) {
                      *(undefined4 *)
                       &(instrl->
                        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                        )._M_impl.super__Vector_impl_data._M_start = 0x1c;
                      goto LAB_0013ab4b;
                    }
                    lVar12 = (long)iVar15 + 1;
                    uVar11 = 0;
                    while( true ) {
                      while( true ) {
                        iVar6 = (int)uVar11;
                        if ((0x20 < (ulong)(byte)this[uVar11 + lVar12]) ||
                           ((0x100000600U >> ((ulong)(byte)this[uVar11 + lVar12] & 0x3f) & 1) == 0))
                        break;
                        uVar11 = (ulong)(iVar6 + 1);
                      }
                      uVar5 = ReadComment((char *)(this + uVar11 + lVar12));
                      if (uVar5 == 0) break;
                      uVar11 = (ulong)(iVar6 + uVar5);
                    }
                    if (-1 < (int)local_98) {
                      Instruction::Instruction
                                (&local_88,INSTR_JUMP_TO,
                                 (int)((ulong)(*(long *)(text + 8) - *(long *)text) >> 4));
                      Instruction::operator=
                                ((Instruction *)((local_98 & 0xffffffff) * 0x10 + *(long *)text),
                                 &local_88);
                      Instruction::~Instruction(&local_88);
                    }
                    if (-1 < (int)local_a0) {
                      Instruction::Instruction
                                (&local_88,INSTR_JUMP_ELSE,
                                 (int)((ulong)(*(long *)(text + 8) - *(long *)text) >> 4));
                      Instruction::operator=
                                ((Instruction *)((local_a0 & 0xffffffff) * 0x10 + *(long *)text),
                                 &local_88);
                      Instruction::~Instruction(&local_88);
                    }
                    iVar15 = iVar6 + iVar15 + 1;
                    lVar12 = (long)iVar15;
                    SVar1 = this[lVar12];
                    while (SVar1 != (Syntax)0x7d) {
                      pSVar13 = this + lVar12;
                      uVar5 = 0;
                      while( true ) {
                        while( true ) {
                          if ((0x20 < (ulong)(byte)pSVar13[uVar5]) ||
                             ((0x100000600U >> ((ulong)(byte)pSVar13[uVar5] & 0x3f) & 1) == 0))
                          break;
                          uVar5 = uVar5 + 1;
                        }
                        uVar8 = ReadComment((char *)(pSVar13 + uVar5));
                        if (uVar8 == 0) break;
                        uVar5 = uVar5 + uVar8;
                      }
                      if ((int)uVar5 < 1) {
                        uVar5 = ReadInstruction(pSVar13,text,instrl,pEVar10);
                        if ((int)uVar5 < 1) {
                          if (uVar5 != 0) {
                            iVar15 = uVar5 - iVar15;
                            goto LAB_0013b0a2;
                          }
                          *(undefined4 *)
                           &(instrl->
                            super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            )._M_impl.super__Vector_impl_data._M_start = 0x22;
                          goto LAB_0013ab4b;
                        }
                      }
                      iVar15 = uVar5 + iVar15;
                      lVar12 = (long)iVar15;
                      SVar1 = this[lVar12];
                    }
                    break;
                  }
                  *(undefined4 *)
                   &(instrl->
                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                    )._M_impl.super__Vector_impl_data._M_start = 0x11;
                }
              }
              goto LAB_0013aaf1;
            }
            iVar15 = iVar15 + iVar6;
LAB_0013aee3:
            lVar12 = (long)iVar15;
          } while (this[lVar12] != (Syntax)0x7d);
        }
        pEVar10 = local_38;
        if (this[iVar15] == (Syntax)0x7d) {
          if (-1 < (int)local_98) {
            Instruction::Instruction
                      (&local_88,INSTR_JUMP_TO,
                       (int)((ulong)(*(long *)(text + 8) - *(long *)text) >> 4));
            Instruction::operator=
                      ((Instruction *)((local_98 & 0xffffffff) * 0x10 + *(long *)text),&local_88);
            Instruction::~Instruction(&local_88);
          }
          if (-1 < (int)local_a0) {
            Instruction::Instruction
                      (&local_88,INSTR_JUMP_ELSE,
                       (int)((ulong)(*(long *)(text + 8) - *(long *)text) >> 4));
            Instruction::operator=
                      ((Instruction *)((local_a0 & 0xffffffff) * 0x10 + *(long *)text),&local_88);
            Instruction::~Instruction(&local_88);
          }
          iVar7 = (int)((ulong)(*(long *)(text + 8) - *(long *)text) >> 4);
          iVar9 = (int)((ulong)pEVar10 >> 4);
          iVar6 = iVar7 - iVar9;
          if (iVar6 != 0 && iVar9 <= iVar7) {
            lVar12 = (long)iVar9 << 4;
            do {
              lVar3 = *(long *)text;
              if ((*(char *)(lVar3 + lVar12) == ';') && (*(char *)(lVar3 + 1 + lVar12) == '\x04')) {
                std::__cxx11::string::string
                          ((string *)&local_88,*(char **)(lVar3 + 8 + lVar12),&local_89);
                iVar9 = std::__cxx11::string::compare((char *)&local_88);
                bVar16 = iVar9 == 0;
                bVar4 = true;
              }
              else {
                bVar4 = false;
                bVar16 = false;
              }
              if ((bVar4) && ((undefined1 *)local_88._0_8_ != local_78)) {
                operator_delete((void *)local_88._0_8_);
              }
              if (bVar16) {
                Instruction::Instruction(&local_68,INSTR_JUMP_TO,iVar7);
                Instruction::operator=((Instruction *)(*(long *)text + lVar12),&local_68);
                Instruction::~Instruction(&local_68);
              }
              lVar12 = lVar12 + 0x10;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          Instruction::Instruction(&local_68,INSTR_VALUE_POP);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
          emplace_back<LiteScript::Instruction>
                    ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                     text,&local_68);
          Instruction::~Instruction(&local_68);
          iVar15 = iVar15 + 1;
          goto LAB_0013b0a2;
        }
        *(undefined4 *)
         &(instrl->
          super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
          _M_impl.super__Vector_impl_data._M_start = 0x1b;
      }
      else {
        *(undefined4 *)
         &(instrl->
          super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
          _M_impl.super__Vector_impl_data._M_start = 0x18;
      }
LAB_0013aaf1:
      iVar15 = -iVar15;
      goto LAB_0013b0a2;
    }
LAB_0013b08b:
    if (iVar7 == 0) {
      *(undefined4 *)
       &(instrl->
        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
        _M_impl.super__Vector_impl_data._M_start = 0x16;
      iVar15 = -iVar6;
      goto LAB_0013b0a2;
    }
  }
  else {
    *(undefined4 *)
     &(instrl->super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
      )._M_impl.super__Vector_impl_data._M_start = 0x17;
    iVar7 = -6;
  }
  iVar15 = iVar7 - iVar6;
LAB_0013b0a2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar15;
}

Assistant:

int LiteScript::Syntax::ReadControlSwitch(const char *text, std::vector<Instruction> &instrl,
                                          Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "switch")
        return 0;
    int i = 6, tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '(') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ')') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '{') {
        errorType = Script::ErrorType::SCRPT_ERROR_BRACE_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jtn = -1, jen = -1, jb = instrl.size();
    while (text[i] != '}') {
        if ((tmp = (int)ReadWhitespace(text + i)) > 0)
            i += tmp;
        else if (ReadName(text + i, keyword) > 0) {
            if (keyword == "case") {
                i += 4;
                i += (int) ReadWhitespace(text + i);
                instrl.push_back(Instruction(InstrCode::INSTR_VALUE_COPY));
                if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
                    if (tmp != 0)
                        return tmp - i;
                    else {
                        errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                        return -i;
                    }
                }
                i += tmp;
                i += (int) ReadWhitespace(text + i);
                if (text[i] != ':') {
                    errorType = Script::ErrorType::SCRPT_ERROR_COLON;
                    return -i;
                }
                ++i;
                i += (int) ReadWhitespace(text + i);
                instrl.push_back((Instruction(InstrCode::INSTR_OP_EQU)));
                jen = instrl.size();
                instrl.push_back((Instruction(InstrCode::INSTR_JUMP_ELSE)));
                if (jtn >= 0)
                    instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
                while (text[i] != '}' && (ReadName(text + i, keyword) == 0 || (keyword != "case" && keyword != "default"))){
                    if ((tmp = (int)ReadWhitespace(text + i)) > 0)
                        i += tmp;
                    else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
                        i += tmp;
                    else {
                        if (tmp != 0)
                            return tmp - i;
                        else {
                            errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                            return -i;
                        }
                    }
                }
                jtn = instrl.size();
                instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
                if (jen >= 0)
                    instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
            }
            else if (keyword == "default") {
                i += 7;
                i += (int) ReadWhitespace(text + i);
                if (text[i] != ':') {
                    errorType = Script::ErrorType::SCRPT_ERROR_COLON;
                    return -i;
                }
                ++i;
                i += (int) ReadWhitespace(text + i);
                if (jtn >= 0)
                    instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
                if (jen >= 0)
                    instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
                while (text[i] != '}') {
                    if ((tmp = (int)ReadWhitespace(text + i)) > 0)
                        i += tmp;
                    else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
                        i += tmp;
                    else {
                        if (tmp != 0)
                            return tmp - i;
                        else {
                            errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                            return -i;
                        }
                    }
                }
                break;
            }
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_SWITCH_KEYWORDS;
                return -i;
            }
        }
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_SWITCH_END;
            return -i;
        }
    }
    if (text[i] != '}') {
        errorType = Script::ErrorType::SCRPT_ERROR_BRACE_CLOSE;
        return -i;
    }
    if (jtn >= 0)
        instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
    if (jen >= 0)
        instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
    for (int it = jb, sz = instrl.size(); it < sz; it++) {
        if (instrl[it].code == InstrCode::INSTR_JUMP_TO &&
            instrl[it].comp_type == Instruction::CompType::COMP_TYPE_STRING &&
            std::string(instrl[it].comp_value.v_string) == "break")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, sz);
    }
    instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
    return i + 1;
}